

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O0

int64_t GetVirtualTransactionInputSize(CTxIn *txin,int64_t nSigOpCost,uint bytes_per_sigop)

{
  int64_t iVar1;
  uint in_EDX;
  CTxIn *in_RSI;
  long in_FS_OFFSET;
  int64_t nWeight;
  
  nWeight = *(int64_t *)(in_FS_OFFSET + 0x28);
  GetTransactionInputWeight(in_RSI);
  iVar1 = GetVirtualTransactionSize(nWeight,(int64_t)in_RSI,in_EDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == nWeight) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetVirtualTransactionInputSize(const CTxIn& txin, int64_t nSigOpCost, unsigned int bytes_per_sigop)
{
    return GetVirtualTransactionSize(GetTransactionInputWeight(txin), nSigOpCost, bytes_per_sigop);
}